

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O1

void __thiscall
Eigen::internal::
gemm_functor<float,_long,_Eigen::internal::general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>,_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_float,_float,_-1,_-1,_-1,_1,_false>_>
::operator()(gemm_functor<float,_long,_Eigen::internal::general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>,_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_float,_float,__1,__1,__1,_1,_false>_>
             *this,long row,long rows,long col,long cols,GemmParallelInfo<long> *info)

{
  long depth;
  long rhsStride;
  long resStride;
  
  if (cols == -1) {
    cols = (this->m_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
  }
  depth = (this->m_lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.
          m_cols;
  rhsStride = (this->m_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
  resStride = (this->m_dest->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
  general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>::run
            (rows,cols,depth,
             (this->m_lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).
             m_storage.m_data + depth * row,depth,
             (this->m_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
             m_storage.m_data + rhsStride * col,rhsStride,
             (this->m_dest->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
             m_storage.m_data + col * resStride + row,1,resStride,this->m_actualAlpha,
             &this->m_blocking->super_level3_blocking<float,_float>,info);
  return;
}

Assistant:

void operator() (Index row, Index rows, Index col=0, Index cols=-1, GemmParallelInfo<Index>* info=0) const
  {
    if(cols==-1)
      cols = m_rhs.cols();

    Gemm::run(rows, cols, m_lhs.cols(),
              &m_lhs.coeffRef(row,0), m_lhs.outerStride(),
              &m_rhs.coeffRef(0,col), m_rhs.outerStride(),
              (Scalar*)&(m_dest.coeffRef(row,col)), m_dest.innerStride(), m_dest.outerStride(),
              m_actualAlpha, m_blocking, info);
  }